

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

Vec_Wrd_t * Zyx_TestCreateTruthTables(int nVars,int nNodes)

{
  int nWords_00;
  Vec_Wrd_t *vInfo_00;
  word *pOut;
  Vec_Wrd_t *vInfo;
  int nWords;
  int i;
  int nNodes_local;
  int nVars_local;
  
  nWords_00 = Abc_TtWordNum(nVars);
  vInfo_00 = Vec_WrdStart(nWords_00 * (nVars + nNodes + 1));
  for (vInfo._4_4_ = 0; vInfo._4_4_ < nVars; vInfo._4_4_ = vInfo._4_4_ + 1) {
    pOut = Zyx_TestTruth(vInfo_00,vInfo._4_4_,nWords_00);
    Abc_TtIthVar(pOut,vInfo._4_4_,nVars);
  }
  return vInfo_00;
}

Assistant:

Vec_Wrd_t * Zyx_TestCreateTruthTables( int nVars, int nNodes )
{
    int i, nWords = Abc_TtWordNum(nVars);
    Vec_Wrd_t * vInfo = Vec_WrdStart( nWords * (nVars + nNodes + 1) ); 
    for ( i = 0; i < nVars; i++ )
        Abc_TtIthVar( Zyx_TestTruth(vInfo, i, nWords), i, nVars );
    //Dau_DsdPrintFromTruth( Maj3_ManTruth(p, p->nObjs), p->nVars );
    return vInfo;
}